

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_do_button_text_symbol
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,char *str
              ,int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
              nk_user_font *font,nk_input *in)

{
  float fVar1;
  uint state_00;
  nk_rect b;
  int iVar2;
  nk_style_item *pnVar3;
  nk_color *pnVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  nk_rect content_00;
  nk_rect content;
  nk_rect bounds_local;
  nk_text local_40;
  
  bounds_local = bounds;
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x32bb,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out != (nk_command_buffer *)0x0) {
    if (font != (nk_user_font *)0x0) {
      iVar2 = nk_do_button(state,out,bounds,style,in,behavior,&content);
      fVar1 = font->height;
      if ((align & 1) == 0) {
        fVar7 = (style->padding).x;
        fVar7 = fVar7 + fVar7 + content.x;
      }
      else {
        fVar7 = (style->padding).x;
        fVar6 = (content.x + content.w) - (fVar7 + fVar7 + fVar1);
        fVar7 = 0.0;
        if (0.0 <= fVar6) {
          fVar7 = fVar6;
        }
      }
      content_00.y = (content.h * 0.5 + content.y) - fVar1 * 0.5;
      content_00.x = fVar7;
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      state_00 = *state;
      pnVar3 = nk_draw_button(out,&bounds_local,state_00,style);
      pnVar4 = &style->text_background;
      if (pnVar3->type == NK_STYLE_ITEM_COLOR) {
        pnVar4 = (nk_color *)&pnVar3->data;
      }
      local_40.background = *pnVar4;
      lVar5 = 0x6c;
      if ((state_00 & 0x10) == 0) {
        lVar5 = (ulong)((state_00 & 0x20) >> 2) + 0x68;
      }
      local_40.text = *(nk_color *)((long)&(style->normal).type + lVar5);
      local_40.padding.x = 0.0;
      local_40.padding.y = 0.0;
      content_00.h = fVar1;
      content_00.w = fVar1;
      nk_draw_symbol(out,symbol,content_00,style->text_background,local_40.text,0.0,font);
      b.y = content.y;
      b.x = content.x;
      b.w = content.w;
      b.h = content.h;
      nk_widget_text(out,b,str,len,&local_40,0x12,font);
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
      return iVar2;
    }
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x32bd,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x32bc,
                "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
               );
}

Assistant:

NK_INTERN int
nk_do_button_text_symbol(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    enum nk_symbol_type symbol, const char *str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect tri = {0,0,0,0};
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    tri.y = content.y + (content.h/2) - font->height/2;
    tri.w = font->height; tri.h = font->height;
    if (align & NK_TEXT_ALIGN_LEFT) {
        tri.x = (content.x + content.w) - (2 * style->padding.x + tri.w);
        tri.x = NK_MAX(tri.x, 0);
    } else tri.x = content.x + 2 * style->padding.x;

    /* draw button */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_symbol(out, &bounds, &content, &tri,
        *state, style, str, len, symbol, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}